

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

bool __thiscall
Imath_3_2::Matrix44<double>::equalWithAbsError(Matrix44<double> *this,Matrix44<double> *m,double e)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  int j;
  int i;
  int local_28;
  int local_24;
  
  local_24 = 0;
  do {
    if (3 < local_24) {
      return true;
    }
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      bVar1 = equalWithAbsError<double>
                        (*(double *)(in_RDI + (long)local_24 * 0x20 + (long)local_28 * 8),
                         *(double *)(in_RSI + (long)local_24 * 0x20 + (long)local_28 * 8),in_XMM0_Qa
                        );
      if (!bVar1) {
        return false;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Matrix44<T>::equalWithAbsError (const Matrix44<T>& m, T e) const IMATH_NOEXCEPT
{
    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
            if (!IMATH_INTERNAL_NAMESPACE::equalWithAbsError (
                    (*this).x[i][j], m.x[i][j], e))
                return false;

    return true;
}